

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cpp
# Opt level: O1

Node * __thiscall
spoa::Graph::BranchCompletion
          (Graph *this,uint32_t rank,vector<long,_std::allocator<long>_> *scores,
          vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_> *predecessors)

{
  long *plVar1;
  uint uVar2;
  pointer ppEVar3;
  pointer ppEVar4;
  Node *pNVar5;
  Node *pNVar6;
  pointer plVar7;
  long lVar8;
  Node *pNVar9;
  ulong uVar10;
  Edge **it;
  pointer ppEVar11;
  pointer ppNVar12;
  Edge **jt;
  pointer ppEVar13;
  
  pNVar9 = (this->rank_to_node_).
           super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>._M_impl.
           super__Vector_impl_data._M_start[rank];
  ppEVar3 = *(pointer *)
             ((long)&(pNVar9->outedges).
                     super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>.
                     _M_impl + 8);
  for (ppEVar11 = (pNVar9->outedges).
                  super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>.
                  _M_impl.super__Vector_impl_data._M_start; ppEVar11 != ppEVar3;
      ppEVar11 = ppEVar11 + 1) {
    ppEVar4 = *(pointer *)
               ((long)&((*ppEVar11)->head->inedges).
                       super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>
                       ._M_impl + 8);
    for (ppEVar13 = ((*ppEVar11)->head->inedges).
                    super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>.
                    _M_impl.super__Vector_impl_data._M_start; ppEVar13 != ppEVar4;
        ppEVar13 = ppEVar13 + 1) {
      if ((*ppEVar13)->tail != pNVar9) {
        (scores->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
        _M_start[(*ppEVar13)->tail->id] = -1;
      }
    }
  }
  uVar10 = (ulong)(rank + 1);
  ppNVar12 = (this->rank_to_node_).
             super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  if (uVar10 < (ulong)((long)(this->rank_to_node_).
                             super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)ppNVar12 >> 3)) {
    pNVar9 = (Node *)0x0;
    do {
      pNVar5 = ppNVar12[uVar10];
      uVar2 = pNVar5->id;
      (scores->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
      _M_start[uVar2] = -1;
      (predecessors->super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>).
      _M_impl.super__Vector_impl_data._M_start[uVar2] = (Node *)0x0;
      ppEVar3 = (pNVar5->inedges).
                super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      for (ppEVar11 = (pNVar5->inedges).
                      super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>.
                      _M_impl.super__Vector_impl_data._M_start; ppEVar11 != ppEVar3;
          ppEVar11 = ppEVar11 + 1) {
        pNVar6 = (*ppEVar11)->tail;
        plVar7 = (scores->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        if (plVar7[pNVar6->id] != -1) {
          lVar8 = (*ppEVar11)->weight;
          if ((plVar7[uVar2] < lVar8) ||
             ((plVar7[uVar2] == lVar8 &&
              (plVar7[(predecessors->
                      super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>)
                      ._M_impl.super__Vector_impl_data._M_start[uVar2]->id] <= plVar7[pNVar6->id])))
             ) {
            plVar7[uVar2] = lVar8;
            (predecessors->
            super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>)._M_impl.
            super__Vector_impl_data._M_start[uVar2] = pNVar6;
          }
        }
      }
      pNVar6 = (predecessors->
               super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>).
               _M_impl.super__Vector_impl_data._M_start[uVar2];
      if (pNVar6 != (Node *)0x0) {
        plVar7 = (scores->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        plVar1 = plVar7 + uVar2;
        *plVar1 = *plVar1 + plVar7[pNVar6->id];
      }
      if ((pNVar9 == (Node *)0x0) ||
         (plVar7 = (scores->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                   super__Vector_impl_data._M_start, plVar7[pNVar9->id] < plVar7[uVar2])) {
        pNVar9 = pNVar5;
      }
      uVar10 = (ulong)((int)uVar10 + 1);
      ppNVar12 = (this->rank_to_node_).
                 super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
    } while (uVar10 < (ulong)((long)(this->rank_to_node_).
                                    super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppNVar12 >> 3
                             ));
  }
  else {
    pNVar9 = (Node *)0x0;
  }
  return pNVar9;
}

Assistant:

Graph::Node* Graph::BranchCompletion(
    std::uint32_t rank,
    std::vector<std::int64_t>* scores,
    std::vector<Node*>* predecessors) {
  auto start = rank_to_node_[rank];
  for (const auto& it : start->outedges) {
    for (const auto& jt : it->head->inedges) {
      if (jt->tail != start) {
        (*scores)[jt->tail->id] = -1;
      }
    }
  }

  Node* max = nullptr;
  for (std::uint32_t i = rank + 1; i < rank_to_node_.size(); ++i) {
    auto it = rank_to_node_[i];
    (*scores)[it->id] = -1;
    (*predecessors)[it->id] = nullptr;

    for (const auto& jt : it->inedges) {
      if ((*scores)[jt->tail->id] == -1) {
        continue;
      }
      if (((*scores)[it->id] < jt->weight) ||
          ((*scores)[it->id] == jt->weight && (*scores)[(*predecessors)[it->id]->id] <= (*scores)[jt->tail->id])) {  // NOLINT
        (*scores)[it->id] = jt->weight;
        (*predecessors)[it->id] = jt->tail;
      }
    }
    if ((*predecessors)[it->id]) {
      (*scores)[it->id] += (*scores)[(*predecessors)[it->id]->id];
    }
    if (!max || (*scores)[max->id] < (*scores)[it->id]) {
      max = it;
    }
  }

  return max;
}